

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

void __thiscall
lf::geometry::Parallelogram::Parallelogram
          (Parallelogram *this,VectorXd *p0,VectorXd *p1,VectorXd *p2)

{
  Matrix<double,__1,_4,_0,__1,_4> *this_00;
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  LhsNested pMVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Index IVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  EVP_PKEY_CTX *pEVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  EVP_PKEY_CTX *pEVar17;
  stringstream ss;
  string local_230;
  undefined1 local_210 [40];
  string local_1e8;
  Matrix<double,__1,_2,_0,__1,_2> *local_1c8;
  Matrix<double,__1,_2,_0,__1,_2> *local_1c0;
  undefined1 local_1b8 [24];
  Matrix<double,__1,_4,_0,__1,_4> *local_1a0;
  variable_if_dynamic<long,__1> local_198;
  variable_if_dynamic<long,__1> vStack_190;
  Index local_188;
  
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_003edc40;
  this_00 = &this->coords_;
  IVar6 = (p0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.m_data =
       (double *)0x0;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.m_rows =
       0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>,IVar6,4);
  IVar6 = (p0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data
       = (double *)0x0;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows
       = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&(this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar6
             ,2);
  local_1c8 = &this->jacobian_inverse_gramian_;
  IVar6 = (p0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_data = (double *)0x0;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_rows = 0;
  local_1c0 = &this->jacobian_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar6,2);
  this->integrationElement_ = 0.0;
  lVar15 = (p0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar15 == (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
    if (lVar15 == (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
                 local_1b8,
                 (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                 m_storage.m_data,
                 (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                 m_storage.m_rows,1);
      local_198.m_value = 0;
      vStack_190.m_value = 0;
      local_188 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      pdVar7 = (p0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      local_1a0 = this_00;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b8,p0,
                 (assign_op<double,_double> *)local_210);
      pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      if (((local_1b8._0_8_ & 7) == 0) &&
         (pEVar13 = (EVP_PKEY_CTX *)(ulong)((uint)((ulong)local_1b8._0_8_ >> 3) & 1),
         (long)local_1b8._8_8_ <= (long)pEVar13)) {
        pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      }
      lVar15 = local_1b8._8_8_ - (long)pEVar13;
      if (0 < (long)pEVar13) {
        pEVar17 = (EVP_PKEY_CTX *)0x0;
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while (pEVar13 != pEVar17);
      }
      pEVar17 = pEVar13 + (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar15) {
        do {
          dVar9 = (pdVar7 + (long)pEVar13)[1];
          *(double *)(local_1b8._0_8_ + pEVar13 * 8) = pdVar7[(long)pEVar13];
          ((double *)(local_1b8._0_8_ + pEVar13 * 8))[1] = dVar9;
          pEVar13 = pEVar13 + 2;
        } while ((long)pEVar13 < (long)pEVar17);
      }
      if ((long)pEVar17 < (long)local_1b8._8_8_) {
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while ((EVP_PKEY_CTX *)local_1b8._8_8_ != pEVar17);
      }
      IVar6 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
                 local_1b8,
                 (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                 m_storage.m_data + IVar6,IVar6,1);
      local_198.m_value = 0;
      vStack_190.m_value = 1;
      local_188 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      pdVar7 = (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      local_1a0 = this_00;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b8,p1,
                 (assign_op<double,_double> *)local_210);
      pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      if (((local_1b8._0_8_ & 7) == 0) &&
         (pEVar13 = (EVP_PKEY_CTX *)(ulong)((uint)((ulong)local_1b8._0_8_ >> 3) & 1),
         (long)local_1b8._8_8_ <= (long)pEVar13)) {
        pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      }
      lVar15 = local_1b8._8_8_ - (long)pEVar13;
      if (0 < (long)pEVar13) {
        pEVar17 = (EVP_PKEY_CTX *)0x0;
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while (pEVar13 != pEVar17);
      }
      pEVar17 = pEVar13 + (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar15) {
        do {
          dVar9 = (pdVar7 + (long)pEVar13)[1];
          *(double *)(local_1b8._0_8_ + pEVar13 * 8) = pdVar7[(long)pEVar13];
          ((double *)(local_1b8._0_8_ + pEVar13 * 8))[1] = dVar9;
          pEVar13 = pEVar13 + 2;
        } while ((long)pEVar13 < (long)pEVar17);
      }
      if ((long)pEVar17 < (long)local_1b8._8_8_) {
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while ((EVP_PKEY_CTX *)local_1b8._8_8_ != pEVar17);
      }
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&local_230,p2,p0,(scalar_difference_op<double,_double> *)local_1b8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_210,p1,(Rhs *)&local_230,(scalar_sum_op<double,_double> *)local_1b8);
      IVar6 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
                 local_1b8,
                 (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                 m_storage.m_data + IVar6 * 2,IVar6,1);
      local_198.m_value = 0;
      vStack_190.m_value = 2;
      local_188 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      lVar15 = *(long *)local_210._0_8_;
      pdVar7 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_210._8_8_)->
               m_storage).m_data;
      lVar8 = *(long *)local_210._16_8_;
      local_1a0 = this_00;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
                ((Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b8,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_210,(assign_op<double,_double> *)&local_1e8);
      pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      if (((local_1b8._0_8_ & 7) == 0) &&
         (pEVar13 = (EVP_PKEY_CTX *)(ulong)((uint)((ulong)local_1b8._0_8_ >> 3) & 1),
         (long)local_1b8._8_8_ <= (long)pEVar13)) {
        pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      }
      lVar12 = local_1b8._8_8_ - (long)pEVar13;
      if (0 < (long)pEVar13) {
        pEVar17 = (EVP_PKEY_CTX *)0x0;
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) =
               (pdVar7[(long)pEVar17] - *(double *)(lVar8 + (long)pEVar17 * 8)) +
               *(double *)(lVar15 + (long)pEVar17 * 8);
          pEVar17 = pEVar17 + 1;
        } while (pEVar13 != pEVar17);
      }
      pEVar17 = pEVar13;
      if (1 < lVar12) {
        do {
          pdVar1 = (double *)(lVar15 + (long)pEVar17 * 8);
          dVar9 = pdVar1[1];
          dVar10 = (pdVar7 + (long)pEVar17)[1];
          pdVar2 = (double *)(lVar8 + (long)pEVar17 * 8);
          dVar11 = pdVar2[1];
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = (pdVar7[(long)pEVar17] - *pdVar2) + *pdVar1;
          ((double *)(local_1b8._0_8_ + pEVar17 * 8))[1] = (dVar10 - dVar11) + dVar9;
          pEVar17 = pEVar17 + 2;
        } while ((long)pEVar17 < (long)(pEVar13 + (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe)))
        ;
      }
      if ((long)(pEVar13 + (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe)) < (long)local_1b8._8_8_
         ) {
        lVar16 = lVar12 / 2;
        lVar3 = lVar16 * 0x10 + (long)pEVar13 * 8;
        lVar14 = 0;
        do {
          *(double *)(local_1b8._0_8_ + (pEVar13 + lVar16 * 2 + lVar14) * 8) =
               (pdVar7[(long)(pEVar13 + lVar16 * 2 + lVar14)] -
               *(double *)(lVar8 + lVar3 + lVar14 * 8)) + *(double *)(lVar15 + lVar3 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar12 % 2 != lVar14);
      }
      IVar6 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
                 local_1b8,
                 (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                 m_storage.m_data + IVar6 * 3,IVar6,1);
      local_198.m_value = 0;
      vStack_190.m_value = 3;
      local_188 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      pdVar7 = (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      local_1a0 = this_00;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                ((Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_1b8,p2,
                 (assign_op<double,_double> *)local_210);
      pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      if (((local_1b8._0_8_ & 7) == 0) &&
         (pEVar13 = (EVP_PKEY_CTX *)(ulong)((uint)((ulong)local_1b8._0_8_ >> 3) & 1),
         (long)local_1b8._8_8_ <= (long)pEVar13)) {
        pEVar13 = (EVP_PKEY_CTX *)local_1b8._8_8_;
      }
      lVar15 = local_1b8._8_8_ - (long)pEVar13;
      if (0 < (long)pEVar13) {
        pEVar17 = (EVP_PKEY_CTX *)0x0;
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while (pEVar13 != pEVar17);
      }
      pEVar17 = pEVar13 + (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < lVar15) {
        do {
          dVar9 = (pdVar7 + (long)pEVar13)[1];
          *(double *)(local_1b8._0_8_ + pEVar13 * 8) = pdVar7[(long)pEVar13];
          ((double *)(local_1b8._0_8_ + pEVar13 * 8))[1] = dVar9;
          pEVar13 = pEVar13 + 2;
        } while ((long)pEVar13 < (long)pEVar17);
      }
      if ((long)pEVar17 < (long)local_1b8._8_8_) {
        do {
          *(double *)(local_1b8._0_8_ + pEVar17 * 8) = pdVar7[(long)pEVar17];
          pEVar17 = pEVar17 + 1;
        } while ((EVP_PKEY_CTX *)local_1b8._8_8_ != pEVar17);
      }
      assertNonDegenerateQuad(this_00,1e-08);
      init(this,pEVar17);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Vector length mismatch p0 <-> p2",0x20);
    pMVar4 = (LhsNested)(local_210 + 0x10);
    local_210._0_8_ = pMVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"p0.size() == p2.size()","")
    ;
    paVar5 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_210,&local_230,0x119,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar5) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((LhsNested)local_210._0_8_ != pMVar4) {
      operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
    }
    local_210._0_8_ = pMVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"false","");
    local_230._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
    base::AssertionFailed((string *)local_210,&local_230,0x119,&local_1e8);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Vector length mismatch p0 <-> p1",0x20);
    pMVar4 = (LhsNested)(local_210 + 0x10);
    local_210._0_8_ = pMVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"p0.size() == p1.size()","")
    ;
    paVar5 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_210,&local_230,0x118,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar5) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((LhsNested)local_210._0_8_ != pMVar4) {
      operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
    }
    local_210._0_8_ = pMVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"false","");
    local_230._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
    base::AssertionFailed((string *)local_210,&local_230,0x118,&local_1e8);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)local_210);
  abort();
}

Assistant:

Parallelogram::Parallelogram(const Eigen::VectorXd& p0,
                             const Eigen::VectorXd& p1,
                             const Eigen::VectorXd& p2)
    : coords_(p0.rows(), 4),
      jacobian_(p0.rows(), 2),
      jacobian_inverse_gramian_(p0.rows(), 2),
      integrationElement_(0) {
  LF_ASSERT_MSG(p0.size() == p1.size(), "Vector length mismatch p0 <-> p1");
  LF_ASSERT_MSG(p0.size() == p2.size(), "Vector length mismatch p0 <-> p2");
  coords_.col(0) = p0;
  coords_.col(1) = p1;
  coords_.col(2) = p1 + (p2 - p0);
  coords_.col(3) = p2;
  assertNonDegenerateQuad(coords_);
  init();
}